

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

bool FastPForLib::Simple16<false>::tryme<4u,5u,2u,4u>(uint32_t *n,size_t len)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  
  sVar2 = 4;
  if (len < 4) {
    sVar2 = len;
  }
  if (len != 0) {
    lVar1 = 0;
    do {
      if (0x1f < n[lVar1]) {
        return false;
      }
      lVar1 = lVar1 + 1;
    } while ((int)sVar2 != (int)lVar1);
  }
  uVar3 = 2;
  if (len - sVar2 < 2) {
    uVar3 = len - sVar2;
  }
  bVar4 = len < 5;
  if (!bVar4) {
    lVar1 = 0;
    do {
      if (0xf < n[sVar2 + lVar1]) {
        return false;
      }
      lVar1 = lVar1 + 1;
    } while ((int)uVar3 != (int)lVar1);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    const uint32_t min2 =
        (len - min1 < num2) ? static_cast<uint32_t>(len - min1) : num2;
    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    return true;
  }